

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O1

void __thiscall
Indexing::HashingClauseVariantIndex::~HashingClauseVariantIndex(HashingClauseVariantIndex *this)

{
  Entry *pEVar1;
  Clause *pCVar2;
  Clause *pCVar3;
  bool bVar4;
  void **head;
  Iterator local_38;
  
  (this->super_ClauseVariantIndex)._vptr_ClauseVariantIndex =
       (_func_int **)&PTR__HashingClauseVariantIndex_00b538b8;
  local_38._base._last = (this->_entries)._afterLast;
  local_38._base._timestamp = (this->_entries)._timestamp;
  local_38._base._next = (this->_entries)._entries;
  while (bVar4 = ::Lib::
                 DHMap<unsigned_int,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                 ::Iterator::hasNext(&local_38), bVar4) {
    pEVar1 = local_38._base._next + 1;
    pCVar2 = (Clause *)(local_38._base._next)->_val;
    while (pCVar3 = pCVar2, local_38._base._next = pEVar1, pCVar3 != (Clause *)0x0) {
      pCVar2 = *(Clause **)&(pCVar3->super_Unit)._inference;
      if (pCVar3 != (Clause *)0x0) {
        *(undefined8 *)&pCVar3->super_Unit = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pCVar3;
      }
    }
  }
  ::Lib::DHMap<unsigned_int,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
  ~DHMap(&this->_entries);
  return;
}

Assistant:

HashingClauseVariantIndex::~HashingClauseVariantIndex()
{
  /*
  unsigned max = 0;
  ClauseList* maxval = 0;
  */

  DHMap<unsigned, ClauseList*>::Iterator iit(_entries);
  while(iit.hasNext()){
    ClauseList* lst = iit.next();

//    unsigned len = lst->length();
//
//    if (len > max) {
//      max = len;
//      maxval->destroy();
//      maxval = lst;
//    } else {
    ClauseList::destroy(lst);
//    }
  }

  /*
  cout << "max bucket of size " << max << endl;
  ClauseList::Iterator it(maxval);
  while (it.hasNext()) {
    Clause* cl = it.next();
    cout << cl->toString() << endl;
  }

  maxval->destroy();
  */
}